

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_sign.c
# Opt level: O0

int crypto_sign(uchar *sm,unsigned_long_long *smlen,uchar *m,unsigned_long_long mlen,uchar *sk)

{
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  long *in_RSI;
  __uint32_t *in_RDI;
  char *in_R8;
  int ret;
  picnic_privatekey_t psk;
  uint32_t len;
  size_t signature_len;
  undefined1 local_9d [97];
  __uint32_t local_3c;
  long local_38 [2];
  size_t local_28;
  void *local_20;
  long *local_18;
  __uint32_t *local_10;
  int local_4;
  
  if (*in_R8 == '\x06') {
    local_38[0] = 0x33262;
    local_3c = 0;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = picnic_read_private_key(local_9d,in_R8,0x61);
    if (iVar1 < 0) {
      picnic_clear_private_key(local_9d);
      local_4 = iVar1;
    }
    else {
      iVar1 = picnic_sign(local_9d,local_20,local_28,(long)local_10 + local_28 + 4,local_38);
      picnic_clear_private_key(local_9d);
      local_4 = iVar1;
      if (iVar1 == 0) {
        local_3c = __uint32_identity((__uint32_t)local_38[0]);
        *local_18 = local_28 + 4 + local_38[0];
        memmove(local_10 + 1,local_20,local_28);
        *local_10 = local_3c;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int crypto_sign(unsigned char* sm, unsigned long long* smlen, const unsigned char* m,
                unsigned long long mlen, const unsigned char* sk) {
  // The first byte encodes the parameter set and is public.
  picnic_declassify(&sk[0], sizeof(unsigned char));
  if (sk[0] != Picnic_L5_UR) {
    return -3;
  }

  size_t signature_len = PICNIC_SIGNATURE_SIZE(Picnic_L5_UR);
  uint32_t len         = 0;

  picnic_privatekey_t psk;
  int ret = picnic_read_private_key(&psk, sk, PICNIC_PRIVATE_KEY_SIZE(Picnic_L5_UR));
  if (ret < 0) {
    picnic_clear_private_key(&psk);
    return ret;
  }

  ret = picnic_sign(&psk, m, mlen, sm + sizeof(len) + mlen, &signature_len);
  picnic_clear_private_key(&psk);
  if (ret) {
    return ret;
  }

  len    = htole32(signature_len);
  *smlen = sizeof(len) + mlen + signature_len;
  // Move the message first in case m and sm overlap.
  memmove(sm + sizeof(len), m, mlen);
  memcpy(sm, &len, sizeof(len));

  return 0;
}